

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O1

void printDifference<float>
               (Serializer *serializer1,Serializer *serializer2,Savepoint *savepoint,
               DataFieldInfo *info1,DataFieldInfo *info2,IJKLBounds *bounds,
               vector<bool,_std::allocator<bool>_> *failed)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  code cVar12;
  ostream *poVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  float *data2;
  float *data1;
  float *local_60;
  float *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  readData<float>(serializer1,info1,savepoint,&local_58);
  readData<float>(serializer2,info2,savepoint,&local_60);
  uVar1 = bounds->iLower;
  uVar2 = bounds->iUpper;
  uVar3 = bounds->jUpper;
  uVar4 = bounds->jLower;
  uVar5 = bounds->kUpper;
  uVar6 = bounds->kLower;
  iVar7 = bounds->lUpper;
  iVar8 = bounds->lLower;
  iVar15 = ((iVar7 - iVar8) + 1) * ((uVar5 - uVar6) + 1) *
           ((uVar3 - uVar4) + 1) * ((uVar2 - uVar1) + 1);
  if ((int)uVar2 < (int)uVar1) {
    iVar22 = 0;
    dVar30 = 0.0;
    dVar28 = 0.0;
    iVar18 = 0;
  }
  else {
    iVar9 = info1->lSize_;
    iVar23 = ((info1->jSize_ * uVar1 + uVar4) * info1->kSize_ + uVar6) * iVar9;
    iVar16 = info1->kSize_ * iVar9;
    dVar28 = 0.0;
    iVar18 = 0;
    iVar22 = 0;
    dVar30 = 0.0;
    do {
      local_50 = (ulong)uVar1;
      uVar11 = uVar4;
      iVar20 = iVar23;
      if ((int)uVar4 <= (int)uVar3) {
        do {
          local_38 = (ulong)uVar11;
          uVar21 = (ulong)uVar6;
          iVar19 = iVar20;
          if ((int)uVar6 <= (int)uVar5) {
            do {
              if (iVar8 <= iVar7) {
                uVar17 = (long)iVar19 + (long)iVar8;
                dVar29 = dVar28;
                iVar14 = (iVar7 - iVar8) + 1;
                do {
                  uVar24 = uVar17 + 0x3f;
                  if (-1 < (long)uVar17) {
                    uVar24 = uVar17;
                  }
                  dVar28 = dVar29;
                  if (((failed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar24 >> 6) +
                        (ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff] >> (uVar17 & 0x3f) & 1) != 0) {
                    iVar18 = iVar18 + 1;
                    dVar27 = (double)local_60[uVar17];
                    iVar22 = iVar22 + (uint)(NAN(local_58[uVar17]) || NAN(local_60[uVar17]));
                    dVar26 = (double)local_58[uVar17] - dVar27;
                    dVar28 = ABS(dVar26);
                    if (dVar28 <= dVar30) {
                      dVar28 = dVar30;
                    }
                    dVar30 = dVar28;
                    dVar28 = ABS(dVar26 / dVar27);
                    if (dVar28 <= dVar29) {
                      dVar28 = dVar29;
                    }
                  }
                  uVar17 = uVar17 + 1;
                  iVar14 = iVar14 + -1;
                  dVar29 = dVar28;
                } while (iVar14 != 0);
              }
              uVar21 = uVar21 + 1;
              iVar19 = iVar19 + iVar9;
            } while (uVar5 + 1 != (int)uVar21);
          }
          iVar20 = iVar20 + iVar16;
          bVar25 = uVar11 != uVar3;
          uVar11 = uVar11 + 1;
        } while (bVar25);
      }
      iVar23 = iVar23 + info1->jSize_ * iVar16;
      bVar25 = uVar1 != uVar2;
      uVar1 = uVar1 + 1;
      local_48 = (ulong)uVar6;
      local_40 = (ulong)uVar5;
    } while (bVar25);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," | Number of values: ",0x15);
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," | Number of errors: ",0x15);
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," | Number of NaN errors: ",0x19);
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," | Percentuage of errors: ",0x1a);
  lVar10 = std::cout;
  *(undefined8 *)(__cxa_call_unexpected + *(long *)(std::cout + -0x18)) = 2;
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar10 + -0x18)) =
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar10 + -0x18)) & 0xfffffefb
       | 4;
  poVar13 = std::ostream::_M_insert<double>(((double)iVar18 * 100.0) / (double)iVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," %\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," | Maximum absolute error: ",0x1b);
  lVar10 = std::cout;
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0x11;
  lVar10 = *(long *)(lVar10 + -0x18);
  if ((&DAT_0013a361)[lVar10] == '\0') {
    cVar12 = (code)std::ios::widen((char)lVar10 + -0x80);
    memmove[lVar10] = cVar12;
    (&DAT_0013a361)[lVar10] = 1;
  }
  memmove[lVar10] = (code)0x20;
  lVar10 = std::cout;
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
       0xfffffefb | 0x100;
  *(undefined8 *)(__cxa_call_unexpected + *(long *)(lVar10 + -0x18)) = 10;
  poVar13 = std::ostream::_M_insert<double>(dVar30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," | Maximum relative error: ",0x1b);
  lVar10 = std::cout;
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0x11;
  lVar10 = *(long *)(lVar10 + -0x18);
  if ((&DAT_0013a361)[lVar10] == '\0') {
    cVar12 = (code)std::ios::widen((char)lVar10 + -0x80);
    memmove[lVar10] = cVar12;
    (&DAT_0013a361)[lVar10] = 1;
  }
  memmove[lVar10] = (code)0x20;
  lVar10 = std::cout;
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
       0xfffffefb | 0x100;
  *(undefined8 *)(__cxa_call_unexpected + *(long *)(lVar10 + -0x18)) = 10;
  poVar13 = std::ostream::_M_insert<double>(dVar28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  if (local_58 != (float *)0x0) {
    operator_delete__(local_58);
  }
  if (local_60 != (float *)0x0) {
    operator_delete__(local_60);
  }
  return;
}

Assistant:

void printDifference(const Serializer& serializer1, const Serializer& serializer2,
                     const Savepoint& savepoint,
                     const DataFieldInfo& info1, const DataFieldInfo& info2,
                     const IJKLBounds& bounds,
                     const vector<bool>& failed)
{
    T* data1;
    readData(serializer1, info1, savepoint, data1);

    T* data2;
    readData(serializer2, info2, savepoint, data2);

    int iSize = info1.iSize();
    int jSize = info1.jSize();
    int kSize = info1.kSize();
    int lSize = info1.lSize();

    int nValues = (bounds.iUpper - bounds.iLower + 1) * (bounds.jUpper - bounds.jLower + 1) *
                  (bounds.kUpper - bounds.kLower + 1) * (bounds.lUpper - bounds.lLower + 1);
    int nErrors = 0;
    unsigned int nNan = 0;

    double maxRelError = 0;
    double maxAbsError = 0;

    for (int i = bounds.iLower; i <= bounds.iUpper; ++i) {
        for (int j = bounds.jLower; j <= bounds.jUpper; ++j) {
            for (int k = bounds.kLower; k <= bounds.kUpper; ++k) {
                for (int l = bounds.lLower; l <= bounds.lUpper; ++l) {
                    int index = i * jSize * kSize * lSize + j * kSize * lSize + k * lSize + l;
                    if (failed[index]) {
                        ++nErrors;

                        const double val = static_cast<double>(data1[index]);
                        const double ref = static_cast<double>(data2[index]);

                        if ((val != val) || (ref != ref)) {
                            ++nNan;
                        }
                        maxAbsError = std::max(maxAbsError, std::fabs(val - ref));
                        maxRelError = std::max(maxRelError, std::fabs((val - ref) / ref));
                    }
                }
            }
        }
    }

    std::cout << " | Number of values: " << std::setw(6) << nValues << "\n";
    std::cout << " | Number of errors: " << std::setw(6) << nErrors << "\n";
    if (nNan > 0) std::cout << " | Number of NaN errors: " << std::setw(6) << nNan << "\n";
    std::cout << " | Percentuage of errors: " << std::setprecision(2) << std::fixed << (100.*nErrors) / nValues << " %\n";
    std::cout << " | Maximum absolute error: " << std::setw(17) << std::setfill(' ') << std::scientific << std::setprecision(10) << maxAbsError  << "\n";
    std::cout << " | Maximum relative error: " << std::setw(17) << std::setfill(' ') << std::scientific << std::setprecision(10) << maxRelError  << "\n";

    delete [] data1;
    delete [] data2;

}